

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::perturbMax
          (SPxSolverBase<double> *this,UpdateVector<double> *uvec,VectorBase<double> *p_low,
          VectorBase<double> *p_up,double eps,double p_delta,int start,int incr)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  double dVar6;
  double dVar7;
  Real RVar8;
  double dVar9;
  Status SVar10;
  double *pdVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  double local_68;
  double local_48;
  
  pdVar4 = (uvec->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar6 = p_delta * 10.0;
  dVar7 = p_delta * 100.0;
  if (this->fullPerturbation == true) {
    uVar12 = ~start + (int)((ulong)((long)(uvec->super_VectorBase<double>).val.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4)
                           >> 3);
    if (-1 < (int)uVar12) {
      pdVar11 = (double *)__tls_get_addr(&PTR_003b6b60);
      dVar1 = *pdVar11;
      local_48 = -p_delta;
      do {
        dVar14 = (p_up->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
        dVar2 = (p_low->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12];
        dVar13 = pdVar4[uVar12];
        ::soplex::infinity::__tls_init();
        if (((dVar14 - dVar1 < local_48) && (p_delta < ABS(dVar2 - dVar14))) &&
           (dVar14 <= dVar13 + p_delta)) {
          RVar8 = Random::next_random(&this->random);
          dVar9 = RVar8 * dVar7 + (1.0 - RVar8) * dVar6 + dVar13;
          (p_up->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] = dVar9;
          this->theShift = (dVar9 - dVar14) + this->theShift;
        }
        ::soplex::infinity::__tls_init();
        if (((p_delta < dVar2 + dVar1) && (p_delta < ABS(dVar2 - dVar14))) &&
           (dVar13 - p_delta <= dVar2)) {
          RVar8 = Random::next_random(&this->random);
          dVar13 = dVar13 - (RVar8 * dVar7 + (1.0 - RVar8) * dVar6);
          (p_low->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] = dVar13;
          this->theShift = this->theShift - (dVar13 - dVar2);
        }
        uVar12 = uVar12 - incr;
      } while (-1 < (int)uVar12);
    }
  }
  else {
    uVar12 = ~start + (uvec->thedelta).super_IdxSet.num;
    if (-1 < (int)uVar12) {
      pdVar5 = (uvec->thedelta).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      local_68 = -eps;
      pdVar11 = (double *)__tls_get_addr(&PTR_003b6b60);
      dVar1 = *pdVar11;
      do {
        iVar3 = (uvec->thedelta).super_IdxSet.idx[uVar12];
        dVar14 = pdVar5[iVar3];
        dVar2 = (p_up->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar3];
        dVar13 = (p_low->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar3];
        SVar10 = SPxBasisBase<double>::dualStatus
                           (&this->super_SPxBasisBase<double>,
                            (this->super_SPxBasisBase<double>).theBaseId.data + iVar3);
        if (SVar10 != D_ON_BOTH) {
          if (dVar14 <= eps) {
            if ((((dVar14 < local_68) && (::soplex::infinity::__tls_init(), eps < dVar13 + dVar1))
                && (eps < ABS(dVar13 - dVar2))) && (dVar14 = pdVar4[iVar3], dVar14 <= dVar13 + eps))
            {
              RVar8 = Random::next_random(&this->random);
              dVar14 = dVar14 - (RVar8 * dVar7 + (1.0 - RVar8) * dVar6);
              (p_low->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3] = dVar14;
              this->theShift = this->theShift - (dVar14 - dVar13);
            }
          }
          else {
            ::soplex::infinity::__tls_init();
            if (((dVar2 - dVar1 < local_68) && (eps < ABS(dVar13 - dVar2))) &&
               (dVar14 = pdVar4[iVar3], dVar2 - eps <= dVar14)) {
              RVar8 = Random::next_random(&this->random);
              dVar14 = dVar14 + RVar8 * dVar7 + (1.0 - RVar8) * dVar6;
              (p_up->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3] = dVar14;
              this->theShift = (dVar14 - dVar2) + this->theShift;
            }
          }
        }
        uVar12 = uVar12 - incr;
      } while (-1 < (int)uVar12);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMax(
   const UpdateVector<R>& uvec,
   VectorBase<R>& p_low,
   VectorBase<R>& p_up,
   R eps,
   R p_delta,
   int start,
   int incr)
{
   assert(uvec.dim() == p_low.dim());
   assert(uvec.dim() == p_up.dim());

   const R* vec = uvec.get_const_ptr();
   R minrandom = 10.0 * p_delta;
   R maxrandom = 100.0 * p_delta;
   R x, l, u;
   int i;

   if(fullPerturbation)
   {
      eps = p_delta;

      for(i = uvec.dim() - start - 1; i >= 0; i -= incr)
      {
         u = p_up[i];
         l = p_low[i];
         x = vec[i];

         if(LT(u, R(infinity), eps) && NE(l, u, eps) && u <= x + eps)
         {
            p_up[i] = x + random.next((double)minrandom, (double)maxrandom);
            theShift += p_up[i] - u;
         }

         if(GT(l, R(-infinity), eps) && NE(l, u, eps) && l >= x - eps)
         {
            p_low[i] = x - random.next((double)minrandom, (double)maxrandom);
            theShift -= p_low[i] - l;
         }
      }
   }
   else
   {
      const R* upd = uvec.delta().values();
      const IdxSet& idx = uvec.delta().indices();

      for(int j = uvec.delta().size() - start - 1; j >= 0; j -= incr)
      {
         i = idx.index(j);
         x = upd[i];
         u = p_up[i];
         l = p_low[i];

         // do not permute these bounds! c.f. computeFrhs2() in spxvecs.cpp
         if(this->dualStatus(this->baseId(i)) == SPxBasisBase<R>::Desc::D_ON_BOTH)
         {
            continue;
         }

         if(x > eps)
         {
            if(LT(u, R(infinity), eps) && NE(l, u, eps) && vec[i] >= u - eps)
            {
               p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
               theShift += p_up[i] - u;
            }
         }
         else if(x < -eps)
         {
            if(GT(l, R(-infinity), eps) && NE(l, u, eps) && vec[i] <= l + eps)
            {
               p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
               theShift -= p_low[i] - l;
            }
         }
      }
   }
}